

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Simplex_tree_vec_fil>::insert_simplex_and_subfaces<std::initializer_list<int>>
          (Simplex_tree<Simplex_tree_vec_fil> *this,initializer_list<int> *Nsimplex,
          Filtration_value *filtration)

{
  int iVar1;
  long lVar2;
  initializer_list<int> __ils;
  initializer_list<int> __ils_00;
  bool bVar3;
  Vertex_handle VVar4;
  iterator iVar5;
  reference piVar6;
  iterator iVar7;
  difference_type dVar8;
  int *piVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_00;
  undefined8 extraout_RDX;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>,_bool>
  pVar11;
  int local_f8;
  undefined1 local_f1;
  undefined8 *local_f0;
  int local_e4;
  iterator iStack_e0;
  Vertex_handle v;
  iterator __end0;
  iterator __begin0;
  vector<int,_std::allocator<int>_> *__range3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  const_iterator local_b8;
  const_iterator local_b0;
  int *local_a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_unique;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  const_iterator local_70;
  bool local_61;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
  local_60;
  pointer local_58;
  pointer local_50;
  int *local_48;
  int *last;
  pointer local_38;
  int *local_30;
  int *first;
  Filtration_value *filtration_local;
  initializer_list<int> *Nsimplex_local;
  Simplex_tree<Simplex_tree_vec_fil> *this_local;
  undefined8 uVar10;
  
  last = (filtration->super_vector<int,_std::allocator<int>_>).
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  local_38 = (filtration->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  __ils._M_array =
       (filtration->super_vector<int,_std::allocator<int>_>).
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  __ils._M_len = (size_type)
                 (filtration->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
  filtration_local = filtration;
  Nsimplex_local = Nsimplex;
  this_local = this;
  local_30 = std::begin<int>(__ils);
  local_58 = (filtration_local->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  local_50 = (filtration_local->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  __ils_00._M_array =
       (filtration_local->super_vector<int,_std::allocator<int>_>).
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  __ils_00._M_len =
       (size_type)
       (filtration_local->super_vector<int,_std::allocator<int>_>).
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  local_48 = std::end<int>(__ils_00);
  if (local_30 == local_48) {
    null_simplex();
    local_61 = true;
    std::
    pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>,_bool>
    ::
    pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>,_bool,_true>
              ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>,_bool>
                *)this,&local_60,&local_61);
    uVar10 = extraout_RDX;
  }
  else {
    if ((char)in_FS_OFFSET[-5] == '\0') {
      lVar2 = *in_FS_OFFSET;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)(lVar2 + -0x40));
      __cxa_thread_atexit(std::vector<int,_std::allocator<int>_>::~vector,
                          (vector<int,_std::allocator<int>_> *)(lVar2 + -0x40),&__dso_handle);
      *(undefined1 *)(in_FS_OFFSET + -5) = 1;
    }
    std::vector<int,_std::allocator<int>_>::clear
              ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0x40));
    lVar2 = *in_FS_OFFSET;
    local_78._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0x40));
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_70,
               &local_78);
    std::vector<int,std::allocator<int>>::insert<int_const*,void>
              ((vector<int,std::allocator<int>> *)(lVar2 + -0x40),local_70,local_30,local_48);
    iVar5 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0x40));
    last_unique._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0x40));
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
               last_unique);
    local_a0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0x40));
    local_a8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0x40));
    local_98 = std::unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         (local_a0,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )local_a8);
    lVar2 = *in_FS_OFFSET;
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_b0,
               &local_98);
    local_c0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0x40));
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_b8,
               &local_c0);
    std::vector<int,_std::allocator<int>_>::erase
              ((vector<int,_std::allocator<int>_> *)(lVar2 + -0x40),local_b0,local_b8);
    lVar2 = *in_FS_OFFSET;
    __end0 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)(lVar2 + -0x40));
    iStack_e0 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)(lVar2 + -0x40));
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffff20);
      if (!bVar3) break;
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end0);
      iVar1 = *piVar6;
      local_e4 = iVar1;
      VVar4 = null_vertex((Simplex_tree<Simplex_tree_vec_fil> *)Nsimplex);
      local_f1 = 0;
      if (iVar1 == VVar4) {
        local_f0 = (undefined8 *)__cxa_allocate_exception(8);
        local_f1 = 1;
        *local_f0 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(local_f0,&char_const*::typeinfo,0);
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end0);
    }
    iVar5 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0x40));
    iVar7 = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0x40));
    dVar8 = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       iVar5._M_current,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       iVar7._M_current);
    local_f8 = (int)dVar8 + -1;
    piVar9 = std::max<int>((int *)(Nsimplex + 8),&local_f8);
    *(int *)&Nsimplex[8]._M_array = *piVar9;
    first_00._M_current = (int *)root((Simplex_tree<Simplex_tree_vec_fil> *)Nsimplex);
    iVar5 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0x40));
    iVar7 = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)(*in_FS_OFFSET + -0x40));
    pVar11 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (this,(Siblings *)Nsimplex,first_00,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        iVar5._M_current,(Filtration_value *)iVar7._M_current);
    uVar10 = pVar11._8_8_;
  }
  pVar11._8_8_ = uVar10;
  pVar11.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>
        *)this;
  return pVar11;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }